

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O1

void __thiscall xray_re::xr_glow_object::load(xr_glow_object *this,xr_reader *r)

{
  float *pfVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uint16_t version;
  short local_12;
  
  local_12 = (short)((ulong)in_RAX >> 0x30);
  sVar2 = xr_reader::r_raw_chunk(r,0xc411,&local_12,2);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x12,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  if ((ushort)(local_12 - 0x11U) < 2) {
    xr_custom_object::load(&this->super_xr_custom_object,r);
    sVar2 = xr_reader::find_chunk(r,0xc414);
    if (sVar2 != 0) {
      xr_reader::r_sz(r,&this->m_shader);
    }
    sVar2 = xr_reader::find_chunk(r,0xc415);
    if (sVar2 != 0) {
      xr_reader::r_sz(r,&this->m_texture);
      sVar2 = xr_reader::find_chunk(r,0xc413);
      if (sVar2 != 0) {
        pfVar1 = (float *)(r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
        this->m_radius = *pfVar1;
        if (local_12 == 0x11) {
          pfVar1 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
          (this->super_xr_custom_object).m_position.field_0.field_0.x = *pfVar1;
          pfVar1 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
          (this->super_xr_custom_object).m_position.field_0.field_0.y = *pfVar1;
          pfVar1 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
          (this->super_xr_custom_object).m_position.field_0.field_0.z = *pfVar1;
        }
        xr_reader::r_raw_chunk(r,0xc416,&this->m_flags,2);
        return;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                    ,0x22,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                  ,0x1d,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
  }
  __assert_fail("version == GLOW_VERSION_17 || version == GLOW_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_glows.cxx"
                ,0x13,"virtual void xray_re::xr_glow_object::load(xr_reader &)");
}

Assistant:

void xr_glow_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GLOW_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GLOW_VERSION_17 || version == GLOW_VERSION);

	xr_custom_object::load(r);

	if (r.find_chunk(GLOW_CHUNK_SHADER)) {
		r.r_sz(m_shader);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(GLOW_CHUNK_TEXTURE))
		xr_not_expected();
	r.r_sz(m_texture);
	r.debug_find_chunk();

	if (!r.find_chunk(GLOW_CHUNK_PARAMS))
		xr_not_expected();
	m_radius = r.r_float();
	if (version == GLOW_VERSION_17)
		r.r_fvector3(co_position());
	r.debug_find_chunk();

	r.r_chunk<uint16_t>(GLOW_CHUNK_FLAGS, m_flags);
}